

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O3

char * tnt_strerror(tnt_stream *s)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  
  pvVar1 = s->data;
  if ((long)*(int *)((long)pvVar1 + 0xf0) == 3) {
    pcVar2 = strerror(*(int *)((long)pvVar1 + 0xf4));
    pcVar3 = tnt_strerror::msg;
    snprintf(tnt_strerror::msg,0x100,"%s (errno: %d)",pcVar2,(ulong)*(uint *)((long)pvVar1 + 0xf4));
  }
  else {
    pcVar3 = tnt_error_list[*(int *)((long)pvVar1 + 0xf0)].desc;
  }
  return pcVar3;
}

Assistant:

char *tnt_strerror(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (sn->error == TNT_ESYSTEM) {
		static char msg[256];
		snprintf(msg, sizeof(msg), "%s (errno: %d)",
			 strerror(sn->errno_), sn->errno_);
		return msg;
	}
	return tnt_error_list[(int)sn->error].desc;
}